

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode sasl_create_cram_md5_message
                   (SessionHandle *data,char *chlg,char *userp,char *passwdp,char **outptr,
                   size_t *outlen)

{
  uint uVar1;
  size_t uznum;
  HMAC_context *ctxt_00;
  char *inputbuff;
  char *response;
  uchar digest [16];
  HMAC_context *ctxt;
  size_t chlglen;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  char *passwdp_local;
  char *userp_local;
  char *chlg_local;
  SessionHandle *data_local;
  
  ctxt = (HMAC_context *)0x0;
  if (chlg != (char *)0x0) {
    ctxt = (HMAC_context *)strlen(chlg);
  }
  uznum = strlen(passwdp);
  uVar1 = curlx_uztoui(uznum);
  ctxt_00 = Curl_HMAC_init(Curl_HMAC_MD5,(uchar *)passwdp,uVar1);
  if (ctxt_00 == (HMAC_context *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (ctxt != (HMAC_context *)0x0) {
      uVar1 = curlx_uztoui((size_t)ctxt);
      Curl_HMAC_update(ctxt_00,(uchar *)chlg,uVar1);
    }
    Curl_HMAC_final(ctxt_00,(uchar *)&response);
    inputbuff = curl_maprintf("%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
                              userp,(ulong)(byte)response,(ulong)response._1_1_,
                              (ulong)response._2_1_,(ulong)response._3_1_,(uint)response._4_1_,
                              (uint)response._5_1_,(uint)response._6_1_,(uint)response._7_1_,
                              (uint)digest[0],(uint)digest[1],(uint)digest[2],(uint)digest[3],
                              (uint)digest[4],(uint)digest[5],(uint)digest[6],(uint)digest[7]);
    if (inputbuff == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      data_local._4_4_ = Curl_base64_encode(data,inputbuff,0,outptr,outlen);
      (*Curl_cfree)(inputbuff);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode sasl_create_cram_md5_message(struct SessionHandle *data,
                                             const char *chlg,
                                             const char *userp,
                                             const char *passwdp,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlglen = 0;
  HMAC_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char *response;

  if(chlg)
    chlglen = strlen(chlg);

  /* Compute the digest using the password as the key */
  ctxt = Curl_HMAC_init(Curl_HMAC_MD5,
                        (const unsigned char *) passwdp,
                        curlx_uztoui(strlen(passwdp)));
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  if(chlglen > 0)
    Curl_HMAC_update(ctxt, (const unsigned char *) chlg,
                     curlx_uztoui(chlglen));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, digest);

  /* Generate the response */
  response = aprintf(
      "%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
           userp, digest[0], digest[1], digest[2], digest[3], digest[4],
           digest[5], digest[6], digest[7], digest[8], digest[9], digest[10],
           digest[11], digest[12], digest[13], digest[14], digest[15]);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  free(response);

  return result;
}